

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_hpf_uninit(ma_hpf *pHPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_hpf1 *pmVar1;
  ma_hpf2 *pmVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  if (pHPF != (ma_hpf *)0x0) {
    uVar3 = pHPF->hpf1Count;
    if (uVar3 != 0) {
      lVar5 = 0x20;
      uVar4 = 0;
      do {
        pmVar1 = pHPF->pHPF1;
        if ((pmVar1 != (ma_hpf1 *)0x0) && (*(int *)((long)&pmVar1->format + lVar5) != 0)) {
          ma_free(*(void **)((long)pmVar1 + lVar5 + -8),pAllocationCallbacks);
          uVar3 = pHPF->hpf1Count;
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x28;
      } while (uVar4 < uVar3);
    }
    uVar3 = pHPF->hpf2Count;
    if (uVar3 != 0) {
      lVar5 = 0x38;
      uVar4 = 0;
      do {
        pmVar2 = pHPF->pHPF2;
        if ((pmVar2 != (ma_hpf2 *)0x0) && (*(int *)((long)&(pmVar2->bq).format + lVar5) != 0)) {
          ma_free(*(void **)((long)pmVar2 + lVar5 + -8),pAllocationCallbacks);
          uVar3 = pHPF->hpf2Count;
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x40;
      } while (uVar4 < uVar3);
    }
    if (pHPF->_ownsHeap != 0) {
      ma_free(pHPF->_pHeap,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_hpf_uninit(ma_hpf* pHPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ihpf1;
    ma_uint32 ihpf2;

    if (pHPF == NULL) {
        return;
    }

    for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
        ma_hpf1_uninit(&pHPF->pHPF1[ihpf1], pAllocationCallbacks);
    }

    for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
        ma_hpf2_uninit(&pHPF->pHPF2[ihpf2], pAllocationCallbacks);
    }

    if (pHPF->_ownsHeap) {
        ma_free(pHPF->_pHeap, pAllocationCallbacks);
    }
}